

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

bool __thiscall sglr::rc::Texture1D::isComplete(Texture1D *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  TextureFormat *format;
  size_t *psVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  IVec3 *pIVar11;
  
  uVar1 = (this->super_Texture).m_baseLevel;
  uVar5 = (ulong)uVar1;
  if ((0xd < uVar5) || ((this->m_levels).m_data[uVar5].m_cap == 0)) {
    return false;
  }
  bVar4 = true;
  if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
    uVar2 = (this->m_levels).m_access[uVar5].super_ConstPixelBufferAccess.m_size.m_data[0];
    iVar8 = ((this->super_Texture).m_maxLevel - uVar1) + 1;
    uVar10 = 0x20;
    if (uVar2 != 0) {
      uVar10 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = uVar10 ^ 0x1f;
    }
    iVar9 = 0x20 - uVar10;
    if (iVar8 < (int)(0x20 - uVar10)) {
      iVar9 = iVar8;
    }
    psVar7 = &(this->m_levels).m_data[uVar5 + 1].m_cap;
    uVar6 = 1;
    pIVar11 = &(this->m_levels).m_access[uVar5 + 1].super_ConstPixelBufferAccess.m_size;
    while (((bVar4 = (long)iVar9 <= (long)uVar6, (long)uVar6 < (long)iVar9 && (0xe - uVar1 != uVar6)
            ) && (*psVar7 != 0))) {
      iVar8 = (int)uVar2 >> ((byte)uVar6 & 0x1f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      if (pIVar11->m_data[0] != iVar8) {
        return bVar4;
      }
      if (*(ChannelOrder *)((long)(pIVar11 + -1) + 4) !=
          (this->m_levels).m_access[uVar5].super_ConstPixelBufferAccess.m_format.order) {
        return bVar4;
      }
      uVar6 = uVar6 + 1;
      psVar7 = psVar7 + 2;
      lVar3 = (long)(pIVar11 + -1);
      pIVar11 = (IVec3 *)((long)(pIVar11 + 3) + 4);
      if (*(ChannelType *)(lVar3 + 8) !=
          (this->m_levels).m_access[uVar5].super_ConstPixelBufferAccess.m_format.type) {
        return bVar4;
      }
    }
  }
  return bVar4;
}

Assistant:

int							getMaxLevel		(void) const	{ return m_maxLevel;		}